

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::convert_to_f32
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr,uint32_t components)

{
  char (*ts_3) [2];
  string local_190;
  undefined1 local_170 [208];
  uint *local_a0;
  size_t local_98;
  size_t local_90;
  uint local_88 [8];
  undefined1 local_68 [28];
  TypeID local_4c;
  __node_base_ptr *local_48;
  size_type local_40;
  __node_base local_38;
  size_type sStack_30;
  float local_28;
  size_t local_20;
  __node_base_ptr p_Stack_18;
  
  local_170._12_4_ = 0x17 - (uint)(components < 2);
  local_170._32_8_ = local_170 + 0x38;
  local_170._8_4_ = 0;
  local_170._0_8_ = &PTR__SPIRType_00354178;
  local_170._20_4_ = 0;
  local_170._40_8_ = 0;
  ts_3 = (char (*) [2])0x8;
  local_170._48_8_ = 8;
  local_170._88_8_ = local_170 + 0x70;
  local_170._96_8_ = 0;
  local_170._104_8_ = 8;
  local_170._120_4_ = 0;
  local_170[0x7c] = false;
  local_170[0x7d] = false;
  local_170._128_4_ = 0;
  local_170._132_4_ = 0;
  local_170._136_4_ = 0;
  local_170._140_4_ = 0;
  local_170._144_4_ = StorageClassGeneric;
  local_170._152_8_ = local_170 + 0xb0;
  local_170._160_8_ = 0;
  local_170._168_8_ = 8;
  local_a0 = local_88;
  local_98 = 0;
  local_90 = 8;
  local_48 = &p_Stack_18;
  local_68._0_7_ = 0;
  local_68._7_4_ = 0;
  local_68._12_4_ = 0;
  local_68._16_4_ = ImageFormatUnknown;
  local_68._20_4_ = AccessQualifierReadOnly;
  local_68._24_4_ = 0;
  local_4c.id = 0;
  local_40 = 1;
  local_38._M_nxt = (_Hash_node_base *)0x0;
  sStack_30 = 0;
  local_28 = 1.0;
  local_20 = 0;
  p_Stack_18 = (__node_base_ptr)0x0;
  local_170._16_4_ = Float;
  local_170._28_4_ = 1;
  local_170._24_4_ = components;
  CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
            (&local_190,&this->super_CompilerGLSL,(SPIRType *)local_170);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_190,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
             (char (*) [2])expr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,ts_3);
  ::std::__cxx11::string::~string((string *)&local_190);
  SPIRType::~SPIRType((SPIRType *)local_170);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::convert_to_f32(const string &expr, uint32_t components)
{
	SPIRType t { components > 1 ? OpTypeVector : OpTypeFloat };
	t.basetype = SPIRType::Float;
	t.vecsize = components;
	t.columns = 1;
	return join(type_to_glsl_constructor(t), "(", expr, ")");
}